

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall
ScopeData::ScopeData
          (ScopeData *this,Allocator *allocator,ScopeData *scope,uint uniqueId,
          FunctionData *ownerFunction)

{
  uint uVar1;
  
  this->scope = scope;
  this->uniqueId = uniqueId;
  this->type = SCOPE_FUNCTION;
  this->ownerNamespace = (NamespaceData *)0x0;
  this->ownerFunction = ownerFunction;
  this->ownerType = (TypeBase *)0x0;
  (this->types).allocator = allocator;
  (this->types).data = (this->types).little;
  (this->types).count = 0;
  (this->types).max = 2;
  (this->functions).allocator = allocator;
  (this->functions).data = (this->functions).little;
  (this->functions).count = 0;
  (this->functions).max = 2;
  (this->variables).allocator = allocator;
  (this->variables).data = (this->variables).little;
  (this->variables).count = 0;
  (this->variables).max = 4;
  (this->aliases).allocator = allocator;
  (this->aliases).data = (this->aliases).little;
  (this->aliases).max = 2;
  (this->aliases).count = 0;
  (this->scopes).allocator = allocator;
  (this->scopes).data = (this->scopes).little;
  (this->scopes).count = 0;
  (this->scopes).max = 2;
  DirectChainedMap<IdentifierLookupResult>::DirectChainedMap(&this->idLookupMap,allocator);
  DirectChainedMap<TypeLookupResult>::DirectChainedMap(&this->typeLookupMap,allocator);
  (this->allVariables).allocator = allocator;
  (this->allVariables).data = (this->allVariables).little;
  (this->allVariables).count = 0;
  (this->allVariables).max = 4;
  if (scope == (ScopeData *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = scope->scopeDepth + 1;
  }
  this->scopeDepth = uVar1;
  this->breakDepth = 0;
  this->contiueDepth = 0;
  this->unrestricted = false;
  this->startOffset = 0;
  this->dataSize = 0;
  return;
}

Assistant:

ScopeData(Allocator *allocator, ScopeData *scope, unsigned uniqueId, FunctionData *ownerFunction): scope(scope), uniqueId(uniqueId), type(SCOPE_FUNCTION), ownerNamespace(0), ownerFunction(ownerFunction), ownerType(0), types(allocator), functions(allocator), variables(allocator), aliases(allocator), scopes(allocator), idLookupMap(allocator), typeLookupMap(allocator), allVariables(allocator)
	{
		scopeDepth = scope ? scope->scopeDepth + 1 : 0;
		breakDepth = 0;
		contiueDepth = 0;

		startOffset = 0;
		dataSize = 0;

		unrestricted = false;
	}